

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Minefield_Data_PDU::Minefield_Data_PDU(Minefield_Data_PDU *this)

{
  Minefield_Data_PDU *this_local;
  
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_Data_PDU_0032b848;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ReqID);
  this->m_ui8ReqID = '\0';
  this->m_ui8PduSeqNum = '\0';
  this->m_ui8NumPdus = '\0';
  this->m_ui8NumMines = '\0';
  this->m_ui8NumSensTyp = '\0';
  this->m_ui8Padding1 = '\0';
  DATA_TYPE::MinefieldDataFilter::MinefieldDataFilter(&this->m_DataFilter);
  DATA_TYPE::EntityType::EntityType(&this->m_MineTyp);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vui16SensorTypes);
  std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::vector
            (&this->m_vMines);
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui8PDUType = '\'';
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = 0x2c;
  (this->m_SeqNumUnion).m_ui16SeqNum = 0;
  return;
}

Assistant:

Minefield_Data_PDU::Minefield_Data_PDU() :
    m_ui8ReqID( 0 ),
    m_ui8PduSeqNum( 0 ),
    m_ui8NumPdus( 0 ),
    m_ui8NumMines( 0 ),
    m_ui8NumSensTyp( 0 ),
    m_ui8Padding1( 0 )
{
    m_ui8PDUType = MinefieldData_PDU_Type;
    m_ui16PDULength = MINEFIELD_DATA_PDU_SIZE;
    m_SeqNumUnion.m_ui16SeqNum = 0;
}